

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

uint8_t * binToHex(uint8_t *src,size_t size)

{
  uint8_t uVar1;
  ulong local_38;
  uint64_t i;
  uint8_t *hex;
  uint64_t hex_size;
  size_t size_local;
  uint8_t *src_local;
  
  if (src == (uint8_t *)0x0) {
    src_local = (uint8_t *)0x0;
  }
  else if (size == 0) {
    free(src);
    src_local = (uint8_t *)0x0;
  }
  else {
    src_local = (uint8_t *)calloc(size * 2 + 1,1);
    for (local_38 = 0; local_38 < size; local_38 = local_38 + 1) {
      uVar1 = hexLookupNibble((uint8_t)((int)(src[local_38] & 0xf0) >> 4));
      src_local[local_38 * 2] = uVar1;
      uVar1 = hexLookupNibble(src[local_38] & 0xf);
      src_local[local_38 * 2 + 1] = uVar1;
    }
    free(src);
  }
  return src_local;
}

Assistant:

uint8_t* binToHex(uint8_t* src, size_t size)
{
    //sanity checks
    if (src == NULL) { return NULL; }

    if (size == 0) 
    { 
        free(src);
	    return NULL;
    }

    //allocate storage for the hex buffer
    const uint64_t hex_size = 2*size;
    uint8_t* hex = calloc(hex_size+1, sizeof(uint8_t));

    for (uint64_t i=0; i<size; ++i)
    {
	    //split the byte into two nibble halves and look up their hex representation
        hex[(2*i)+0] = hexLookupNibble((src[i] & 0xf0) >> 4);
        hex[(2*i)+1] = hexLookupNibble(src[i] & 0x0f);
    }      

    //free the original buffer and return the hex
    free(src);

    return hex;
}